

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<10,_7,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  float *pfVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  float afStack_88 [4];
  Vector<float,_3> res;
  float local_68 [5];
  undefined8 local_54;
  float local_4c;
  undefined8 uStack_48;
  Matrix<float,_4,_2> retVal;
  Type in0;
  
  pfVar1 = retVal.m_data.m_data[1].m_data + 2;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar7 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar7 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar6) = uVar7;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 == 0x10);
      lVar5 = lVar5 + 1;
      pfVar1 = pfVar1 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar5 != 4);
    retVal.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)evalCtx->in[0].m_data;
  }
  else {
    retVal.m_data.m_data[1].m_data[2] = 0.0;
    retVal.m_data.m_data[1].m_data[3] = 0.0;
    puVar4 = &sr::(anonymous_namespace)::s_constInMat2x4;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar1[lVar5] = *(float *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 == 4);
      lVar3 = lVar3 + 1;
      pfVar1 = pfVar1 + 1;
      puVar4 = puVar4 + 2;
    } while (lVar3 != 4);
  }
  puVar2 = &uStack_48;
  retVal.m_data.m_data[0].m_data[3] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  uStack_48 = 0;
  lVar3 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar3 != lVar6) {
        uVar7 = 0;
      }
      *(undefined4 *)((long)puVar2 + lVar6) = uVar7;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 == 0x10);
    lVar5 = lVar5 + 1;
    puVar2 = (undefined8 *)((long)puVar2 + 4);
    lVar3 = lVar3 + 0x10;
  } while (lVar5 != 4);
  puVar2 = &uStack_48;
  pfVar1 = retVal.m_data.m_data[1].m_data + 2;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      *(uint *)((long)puVar2 + lVar5) = *(uint *)((long)pfVar1 + lVar5) ^ 0x80000000;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 == 0x10);
    lVar3 = lVar3 + 1;
    puVar2 = (undefined8 *)((long)puVar2 + 4);
    pfVar1 = pfVar1 + 1;
  } while (lVar3 != 4);
  stack0xffffffffffffff90 = (Vec4 *)uStack_48;
  local_54 = CONCAT44(retVal.m_data.m_data[1].m_data[0],retVal.m_data.m_data[0].m_data[3]);
  local_4c = retVal.m_data.m_data[1].m_data[1];
  afStack_88[2] = 0.0;
  afStack_88[3] = 0.0;
  res.m_data[0] = 0.0;
  lVar3 = 0;
  do {
    res.m_data[lVar3 + -2] = res.m_data[lVar3 + 2] + *(float *)((long)&local_54 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  stack0xffffffffffffff90 = &evalCtx->color;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)res.m_data[lVar3 + 2]] = afStack_88[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}